

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,float>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *pVVar7;
  bool bVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  undefined8 uVar11;
  char *pcVar12;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  IVal *pIVar16;
  TestError *this_00;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  IVal IVar19;
  ulong uVar20;
  PrecisionCase *pPVar21;
  double dVar22;
  double dVar23;
  IVal in1;
  FuncSet funcs;
  IVal in3;
  IVal in2;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> outputs;
  Environment env;
  ostringstream oss;
  ShaderSpec spec;
  undefined1 auStack_518 [8];
  PrecisionCase *local_510;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *local_508;
  string local_500;
  undefined1 local_4e0 [8];
  undefined8 local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Rb_tree_node_base *local_4c0;
  size_t local_4b8;
  Statement *local_4b0;
  ulong local_4a8;
  long local_4a0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_498;
  FloatFormat *local_490;
  IVal local_488;
  IVal local_468;
  ulong local_448;
  ResultCollector *local_440;
  undefined1 local_438 [8];
  pointer pVStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Data local_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  ulong local_290;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [3];
  ios_base local_1b8 [272];
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar20 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_508 = variables;
  local_4b0 = stmt;
  local_498 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>::Outputs(&local_288,uVar20);
  local_70._M_p = (pointer)&local_60;
  local_a8._0_4_ = GLSL_VERSION_300_ES;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_258._M_impl.super__Rb_tree_header._M_header;
  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_510 = this;
  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"Statement: ",0xb);
  (*local_4b0->_vptr_Statement[2])(local_4b0,(ostringstream *)&pVStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  local_4d8 = (double)((ulong)local_4d8._4_4_ << 0x20);
  local_4d0._M_allocated_capacity = 0;
  local_4b8 = 0;
  local_4d0._8_8_ = (_Rb_tree_node_base *)&local_4d8;
  local_4c0 = (_Rb_tree_node_base *)&local_4d8;
  (*local_4b0->_vptr_Statement[4])(local_4b0,local_4e0);
  if ((_Rb_tree_node_base *)local_4d0._8_8_ != (_Rb_tree_node_base *)&local_4d8) {
    uVar11 = local_4d0._8_8_;
    do {
      (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_228);
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
    } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_4d8);
  }
  if (local_4b8 != 0) {
    local_438 = (undefined1  [8])((local_510->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_430,local_500._M_dataplus._M_p,local_500._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  pcVar12 = glu::getPrecisionName((local_510->m_ctx).precision);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)(auStack_518 + *(long *)((long)local_438 + -0x18)) + 0xe0);
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar12,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_510->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_a8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_510->m_extension)._M_string_length != 0) {
    std::operator+(local_228,"#extension ",&local_510->m_extension);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_228);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar18) {
      local_428._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_428._8_8_ = plVar14[3];
      local_438 = (undefined1  [8])&local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_438 = (undefined1  [8])*plVar14;
    }
    pVStack_430 = (pointer)plVar14[1];
    *plVar14 = (long)paVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_438);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
      operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 8),1);
  makeSymbol<float>((Symbol *)local_438,local_510,
                    (local_508->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)local_a8._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 0x20),2);
  makeSymbol<float>((Symbol *)local_438,local_510,
                    (local_508->out1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)(local_a8._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_438,local_510,
                    (local_508->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)local_a8._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_4b0->_vptr_Statement[2])(local_4b0,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
    operator_delete(local_228[0]._M_dataplus._M_p,local_228[0].field_2._M_allocated_capacity + 1);
  }
  pPVar21 = local_510;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((local_510->m_ctx).renderContext,(local_510->m_ctx).shaderType,
                       (ShaderSpec *)local_a8);
  local_438 = (undefined1  [8])
              (local_498->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  pVStack_430 = (local_498->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_498->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_498->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228[0]._M_dataplus._M_p =
       (pointer)local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_228[0]._M_string_length =
       (size_type)
       local_288.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((pPVar21->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 != '\0') {
    (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
    (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,uVar20 & 0xffffffff,local_438,local_228);
    (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
    pVVar7 = local_508;
    local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffffffffff00);
    pVStack_430 = (pointer)0x7ff0000000000000;
    local_428._M_allocated_capacity = 0xfff0000000000000;
    local_228[0]._M_dataplus._M_p = local_228[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_228[0]._M_string_length = 0x7ff0000000000000;
    local_228[0].field_2._M_allocated_capacity = -INFINITY;
    local_4e0[0] = false;
    local_4d8 = INFINITY;
    local_4d0._M_allocated_capacity = 0xfff0000000000000;
    Environment::bind<float>
              ((Environment *)&local_258,
               (local_508->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_438);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_258,
               (pVVar7->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_500);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_258,
               (pVVar7->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_468);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_258,
               (pVVar7->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_488);
    Environment::bind<float>
              ((Environment *)&local_258,
               (pVVar7->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_228);
    Environment::bind<float>
              ((Environment *)&local_258,
               (pVVar7->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_4e0);
    local_448 = uVar20;
    if (pfVar3 == pfVar2) {
      local_4a8 = 0;
    }
    else {
      local_490 = &(local_510->m_ctx).floatFormat;
      local_440 = &local_510->m_status;
      local_290 = uVar20 + (uVar20 == 0);
      local_4a0 = 0;
      uVar20 = 0;
      local_4a8 = 0;
      pPVar21 = local_510;
      do {
        local_468._0_8_ = local_468._0_8_ & 0xffffffffffffff00;
        local_468.m_lo = INFINITY;
        local_468.m_hi = -INFINITY;
        local_488._0_8_ = local_488._0_8_ & 0xffffffffffffff00;
        local_488.m_lo = INFINITY;
        local_488.m_hi = -INFINITY;
        if ((uVar20 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((pPVar21->super_TestCase).super_TestNode.m_testCtx);
        }
        fVar1 = (local_498->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20];
        pp_Var6 = (_func_int **)(double)fVar1;
        bVar8 = NAN(fVar1);
        local_438[0] = bVar8;
        pVStack_430 = (pointer)(_func_int **)0x7ff0000000000000;
        if (!bVar8) {
          pVStack_430 = (pointer)pp_Var6;
        }
        local_428._M_allocated_capacity = (size_type)(_func_int **)0xfff0000000000000;
        if (!bVar8) {
          local_428._M_allocated_capacity = (size_type)pp_Var6;
        }
        tcu::FloatFormat::roundOut((Interval *)local_4e0,local_490,(Interval *)local_438,false);
        tcu::FloatFormat::convert((Interval *)local_228,local_490,(Interval *)local_4e0);
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_258,
                             (local_508->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        pVVar7 = local_508;
        pIVar16->m_hi = (double)local_228[0].field_2._0_8_;
        *(pointer *)pIVar16 = local_228[0]._M_dataplus._M_p;
        pIVar16->m_lo = (double)local_228[0]._M_string_length;
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_258,
                   (local_508->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_258,
                   (pVVar7->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_258,
                   (pVVar7->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        local_410.basic.type = (pPVar21->m_ctx).precision;
        local_418 = local_490->m_maxValue;
        local_438 = *(undefined1 (*) [8])local_490;
        pVStack_430 = *(pointer *)&local_490->m_fractionBits;
        local_428._M_allocated_capacity = *(undefined8 *)&local_490->m_hasInf;
        local_428._8_8_ = *(undefined8 *)&local_490->m_exactPrecision;
        local_400 = 0;
        local_410._8_8_ = &local_258;
        (*local_4b0->_vptr_Statement[3])(local_4b0,(MessageBuilder *)local_438);
        pVVar7 = local_508;
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_258,
                             (local_508->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        tcu::FloatFormat::convert((Interval *)local_438,&local_2b8,pIVar16);
        local_488.m_hi = (double)local_428._M_allocated_capacity;
        local_488._0_8_ = local_438;
        uVar11 = local_488._0_8_;
        local_488.m_lo = (double)pVStack_430;
        fVar1 = local_288.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20];
        dVar22 = (double)fVar1;
        dVar23 = dVar22;
        if (NAN(fVar1)) {
          dVar23 = INFINITY;
          dVar22 = -INFINITY;
        }
        IVar19 = (IVal)(dVar22 <= (double)local_428._M_allocated_capacity &&
                       (double)pVStack_430 <= dVar23);
        if ((NAN(fVar1)) &&
           (dVar22 <= (double)local_428._M_allocated_capacity && (double)pVStack_430 <= dVar23)) {
          local_488.m_hasNaN = local_438[0];
          IVar19 = (IVal)local_488.m_hasNaN;
        }
        local_438 = (undefined1  [8])&local_428;
        local_488._0_8_ = uVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 1 is outside acceptable range","");
        bVar8 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar19 & 1),(string *)local_438);
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
        }
        pIVar16 = Environment::lookup<float>
                            ((Environment *)&local_258,
                             (pVVar7->out0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                             .m_ptr);
        tcu::FloatFormat::convert((Interval *)local_438,&local_2b8,pIVar16);
        local_468.m_hi = (double)local_428._M_allocated_capacity;
        local_468._0_8_ = local_438;
        uVar11 = local_468._0_8_;
        local_468.m_lo = (double)pVStack_430;
        fVar1 = local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20];
        dVar22 = (double)fVar1;
        dVar23 = dVar22;
        if (NAN(fVar1)) {
          dVar23 = INFINITY;
          dVar22 = -INFINITY;
        }
        IVar19 = (IVal)(dVar22 <= (double)local_428._M_allocated_capacity &&
                       (double)pVStack_430 <= dVar23);
        if ((NAN(fVar1)) &&
           (dVar22 <= (double)local_428._M_allocated_capacity && (double)pVStack_430 <= dVar23)) {
          local_468.m_hasNaN = local_438[0];
          IVar19 = (IVal)local_468.m_hasNaN;
        }
        local_438 = (undefined1  [8])&local_428;
        local_468._0_8_ = uVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"Shader output 0 is outside acceptable range","");
        bVar9 = tcu::ResultCollector::check(local_440,(bool)((byte)IVar19 & 1),(string *)local_438);
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
        }
        pPVar21 = local_510;
        uVar17 = (int)local_4a8 + ((byte)~(bVar8 && bVar9) & 1);
        local_4a8 = (ulong)uVar17;
        if ((int)uVar17 < 0x65 && (!bVar8 || !bVar9)) {
          local_438 = (undefined1  [8])((local_510->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_430);
          pcVar12 = "Failed";
          if (bVar8 && bVar9) {
            pcVar12 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,pcVar12,6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\t",1);
          pVVar4 = (local_508->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,local_228[0]._M_dataplus._M_p,
                     local_228[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4e0,&local_2b8,
                     (float *)((long)(local_498->in0).
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a0));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                     (long)local_4d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &local_4d0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                            (ulong)(local_4d0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
            operator_delete(local_228[0]._M_dataplus._M_p,
                            local_228[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\t",1);
          pVVar4 = (local_508->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,local_228[0]._M_dataplus._M_p,
                     local_228[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4e0,&local_2b8,
                     (float *)((long)local_288.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a0));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                     (long)local_4d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,"\tExpected range: ",0x11);
          intervalToString<float>(&local_500,&local_2b8,&local_468);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,local_500._M_dataplus._M_p,local_500._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &local_4d0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                            (ulong)(local_4d0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
            operator_delete(local_228[0]._M_dataplus._M_p,
                            local_228[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\t",1);
          pVVar4 = (local_508->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_228[0]._M_dataplus._M_p = (pointer)&local_228[0].field_2;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,local_228[0]._M_dataplus._M_p,
                     local_228[0]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430," = ",3);
          valueToString<float>
                    ((string *)local_4e0,&local_2b8,
                     (float *)((long)local_288.out1.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + local_4a0));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                     (long)local_4d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,"\tExpected range: ",0x11);
          intervalToString<float>(&local_500,&local_2b8,&local_488);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_430,local_500._M_dataplus._M_p,local_500._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &local_4d0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                            (ulong)(local_4d0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
            operator_delete(local_228[0]._M_dataplus._M_p,
                            local_228[0].field_2._M_allocated_capacity + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
        uVar20 = uVar20 + 1;
        local_4a0 = local_4a0 + 4;
      } while (local_290 != uVar20);
    }
    iVar10 = (int)local_4a8;
    if (100 < iVar10) {
      local_438 = (undefined1  [8])((local_510->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_430,iVar10 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    if (iVar10 == 0) {
      local_438 = (undefined1  [8])((local_510->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pVStack_430," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_438 = (undefined1  [8])((local_510->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_430);
      std::ostream::operator<<((ostringstream *)&pVStack_430,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_430,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_430);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pVStack_430," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_430);
    std::ios_base::~ios_base(local_3c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,
                      CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
    if (local_288.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}